

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::HeapType::HeapType(HeapType *this,Struct *struct_)

{
  HeapType HVar1;
  pointer local_18;
  Struct *struct__local;
  HeapType *this_local;
  
  local_18 = (pointer)struct_;
  struct__local = (Struct *)this;
  std::make_unique<wasm::(anonymous_namespace)::HeapTypeInfo,wasm::Struct_const&>
            ((Struct *)&stack0xffffffffffffffe0);
  HVar1 = anon_unknown_0::RecGroupStore::insert
                    ((RecGroupStore *)wasm::(anonymous_namespace)::globalRecGroupStore,
                     (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                      *)&stack0xffffffffffffffe0);
  this->id = (uintptr_t)HVar1;
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                 *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

HeapType::HeapType(const Struct& struct_) {
  new (this) HeapType(
    globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(struct_)));
}